

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O3

void __thiscall QHttpSocketEngine::slotSocketError(QHttpSocketEngine *this,SocketError error)

{
  int *piVar1;
  QDebug this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QString local_78;
  char *local_60;
  QDebug local_58;
  QDebug local_50;
  undefined1 local_48 [8];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(*(long *)(this + 8) + 0x108) == 2) {
    if (error != SocketTimeoutError) {
      *(undefined4 *)(*(long *)(this + 8) + 0x108) = 0;
      QIODevice::errorString();
      QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,error,&local_78);
      piVar1 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10);
        }
      }
      if (error != RemoteHostClosedError) {
        local_78.d.d._0_4_ = 2;
        local_78.d.d._4_4_ = 0;
        local_78.d.ptr._0_4_ = 0;
        local_78.d._12_8_ = 0;
        local_78.d.size._4_4_ = 0;
        local_60 = "default";
        QMessageLogger::debug();
        this_00.stream = local_58.stream;
        QVar2.m_data = (storage_type *)0x35;
        QVar2.m_size = (qsizetype)local_40;
        QString::fromUtf8(QVar2);
        QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_40);
        if (local_40[0] != (QArrayData *)0x0) {
          LOCK();
          (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        *(int *)((QTextStream *)local_58.stream + 0x28) =
             *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
        ::operator<<((Stream *)local_48,(SocketError)&local_50);
        QDebug::~QDebug((QDebug *)local_48);
        QDebug::~QDebug(&local_50);
        QDebug::~QDebug(&local_58);
      }
      emitReadNotification(this);
    }
  }
  else {
    switch(error) {
    case ConnectionRefusedError:
      QMetaObject::tr((char *)&local_78,(char *)&staticMetaObject,0x26d41e);
      error = ProxyConnectionRefusedError;
      break;
    case RemoteHostClosedError:
      QMetaObject::tr((char *)&local_78,(char *)&staticMetaObject,0x26d459);
      error = ProxyConnectionClosedError;
      break;
    case HostNotFoundError:
      QMetaObject::tr((char *)&local_78,(char *)&staticMetaObject,0x26d407);
      error = ProxyNotFoundError;
      break;
    default:
      QIODevice::errorString();
      break;
    case SocketTimeoutError:
      QMetaObject::tr((char *)&local_78,(char *)&staticMetaObject,0x26d437);
      error = ProxyConnectionTimeoutError;
    }
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,error,&local_78);
    piVar1 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),2,0x10)
        ;
      }
    }
    emitConnectionNotification(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpSocketEngine::slotSocketError(QAbstractSocket::SocketError error)
{
    Q_D(QHttpSocketEngine);

    if (d->state != Connected) {
        // we are in proxy handshaking stages
        if (error == QAbstractSocket::HostNotFoundError)
            setError(QAbstractSocket::ProxyNotFoundError, tr("Proxy server not found"));
        else if (error == QAbstractSocket::ConnectionRefusedError)
            setError(QAbstractSocket::ProxyConnectionRefusedError, tr("Proxy connection refused"));
        else if (error == QAbstractSocket::SocketTimeoutError)
            setError(QAbstractSocket::ProxyConnectionTimeoutError, tr("Proxy server connection timed out"));
        else if (error == QAbstractSocket::RemoteHostClosedError)
            setError(QAbstractSocket::ProxyConnectionClosedError, tr("Proxy connection closed prematurely"));
        else
            setError(error, d->socket->errorString());
        emitConnectionNotification();
        return;
    }

    // We're connected
    if (error == QAbstractSocket::SocketTimeoutError)
        return;                 // ignore this error

    d->state = None;
    setError(error, d->socket->errorString());
    if (error != QAbstractSocket::RemoteHostClosedError)
        qDebug() << "QHttpSocketEngine::slotSocketError: got weird error =" << error;
    //read notification needs to always be emitted, otherwise the higher layer doesn't get the disconnected signal
    emitReadNotification();
}